

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.h
# Opt level: O0

void load_GL_VERSION_3_1(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_VERSION_3_1 != 0) {
    glad_glDrawArraysInstanced = (PFNGLDRAWARRAYSINSTANCEDPROC)(*load)("glDrawArraysInstanced");
    glad_glDrawElementsInstanced =
         (PFNGLDRAWELEMENTSINSTANCEDPROC)(*load)("glDrawElementsInstanced");
    glad_glTexBuffer = (PFNGLTEXBUFFERPROC)(*load)("glTexBuffer");
    glad_glPrimitiveRestartIndex =
         (PFNGLPRIMITIVERESTARTINDEXPROC)(*load)("glPrimitiveRestartIndex");
    glad_glCopyBufferSubData = (PFNGLCOPYBUFFERSUBDATAPROC)(*load)("glCopyBufferSubData");
    glad_glGetUniformIndices = (PFNGLGETUNIFORMINDICESPROC)(*load)("glGetUniformIndices");
    glad_glGetActiveUniformsiv = (PFNGLGETACTIVEUNIFORMSIVPROC)(*load)("glGetActiveUniformsiv");
    glad_glGetActiveUniformName = (PFNGLGETACTIVEUNIFORMNAMEPROC)(*load)("glGetActiveUniformName");
    glad_glGetUniformBlockIndex = (PFNGLGETUNIFORMBLOCKINDEXPROC)(*load)("glGetUniformBlockIndex");
    glad_glGetActiveUniformBlockiv =
         (PFNGLGETACTIVEUNIFORMBLOCKIVPROC)(*load)("glGetActiveUniformBlockiv");
    glad_glGetActiveUniformBlockName =
         (PFNGLGETACTIVEUNIFORMBLOCKNAMEPROC)(*load)("glGetActiveUniformBlockName");
    glad_glUniformBlockBinding = (PFNGLUNIFORMBLOCKBINDINGPROC)(*load)("glUniformBlockBinding");
    glad_glBindBufferRange = (PFNGLBINDBUFFERRANGEPROC)(*load)("glBindBufferRange");
    glad_glBindBufferBase = (PFNGLBINDBUFFERBASEPROC)(*load)("glBindBufferBase");
    glad_glGetIntegeri_v = (PFNGLGETINTEGERI_VPROC)(*load)("glGetIntegeri_v");
  }
  return;
}

Assistant:

static void load_GL_VERSION_3_1(GLADloadproc load) {
	if(!GLAD_GL_VERSION_3_1) return;
	glad_glDrawArraysInstanced = (PFNGLDRAWARRAYSINSTANCEDPROC)load("glDrawArraysInstanced");
	glad_glDrawElementsInstanced = (PFNGLDRAWELEMENTSINSTANCEDPROC)load("glDrawElementsInstanced");
	glad_glTexBuffer = (PFNGLTEXBUFFERPROC)load("glTexBuffer");
	glad_glPrimitiveRestartIndex = (PFNGLPRIMITIVERESTARTINDEXPROC)load("glPrimitiveRestartIndex");
	glad_glCopyBufferSubData = (PFNGLCOPYBUFFERSUBDATAPROC)load("glCopyBufferSubData");
	glad_glGetUniformIndices = (PFNGLGETUNIFORMINDICESPROC)load("glGetUniformIndices");
	glad_glGetActiveUniformsiv = (PFNGLGETACTIVEUNIFORMSIVPROC)load("glGetActiveUniformsiv");
	glad_glGetActiveUniformName = (PFNGLGETACTIVEUNIFORMNAMEPROC)load("glGetActiveUniformName");
	glad_glGetUniformBlockIndex = (PFNGLGETUNIFORMBLOCKINDEXPROC)load("glGetUniformBlockIndex");
	glad_glGetActiveUniformBlockiv = (PFNGLGETACTIVEUNIFORMBLOCKIVPROC)load("glGetActiveUniformBlockiv");
	glad_glGetActiveUniformBlockName = (PFNGLGETACTIVEUNIFORMBLOCKNAMEPROC)load("glGetActiveUniformBlockName");
	glad_glUniformBlockBinding = (PFNGLUNIFORMBLOCKBINDINGPROC)load("glUniformBlockBinding");
	glad_glBindBufferRange = (PFNGLBINDBUFFERRANGEPROC)load("glBindBufferRange");
	glad_glBindBufferBase = (PFNGLBINDBUFFERBASEPROC)load("glBindBufferBase");
	glad_glGetIntegeri_v = (PFNGLGETINTEGERI_VPROC)load("glGetIntegeri_v");
}